

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::EndObject(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            *this,Context *context,SizeType memberCount)

{
  ISchemaValidator *pIVar1;
  uint uVar2;
  ValueType *pVVar3;
  Ch *pCVar4;
  Property *pPVar5;
  ISchemaValidator *dependenciesValidator;
  SizeType targetIndex;
  Property *source;
  uint local_28;
  SizeType sourceIndex;
  SizeType index;
  SizeType memberCount_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if ((this->hasRequired_ & 1U) != 0) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x14])();
    for (local_28 = 0; local_28 < this->propertyCount_; local_28 = local_28 + 1) {
      if ((((this->properties_[local_28].required & 1U) != 0) &&
          ((context->propertyExist[local_28] & 1U) == 0)) &&
         ((this->properties_[local_28].schema)->defaultValueLength_ == 0)) {
        (*context->error_handler->_vptr_IValidationErrorHandler[0x15])
                  (context->error_handler,this->properties_ + local_28);
      }
    }
    uVar2 = (*context->error_handler->_vptr_IValidationErrorHandler[0x16])();
    if ((uVar2 & 1) != 0) {
      context->invalidCode = kValidateErrorRequired;
      pVVar3 = GetValidateErrorKeyword(kValidateErrorRequired);
      pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pVVar3);
      context->invalidKeyword = pCVar4;
      return false;
    }
  }
  if (memberCount < this->minProperties_) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x13])
              (context->error_handler,(ulong)memberCount,(ulong)this->minProperties_);
    context->invalidCode = kValidateErrorMinProperties;
    pVVar3 = GetValidateErrorKeyword(kValidateErrorMinProperties);
    pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar3);
    context->invalidKeyword = pCVar4;
    this_local._7_1_ = false;
  }
  else if (this->maxProperties_ < memberCount) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x12])
              (context->error_handler,(ulong)memberCount,(ulong)this->maxProperties_);
    context->invalidCode = kValidateErrorMaxProperties;
    pVVar3 = GetValidateErrorKeyword(kValidateErrorMaxProperties);
    pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar3);
    context->invalidKeyword = pCVar4;
    this_local._7_1_ = false;
  }
  else {
    if ((this->hasDependencies_ & 1U) != 0) {
      (*context->error_handler->_vptr_IValidationErrorHandler[0x19])();
      for (source._4_4_ = 0; source._4_4_ < this->propertyCount_; source._4_4_ = source._4_4_ + 1) {
        pPVar5 = this->properties_ + source._4_4_;
        if ((context->propertyExist[source._4_4_] & 1U) != 0) {
          if (pPVar5->dependencies == (bool *)0x0) {
            if (pPVar5->dependenciesSchema != (SchemaType *)0x0) {
              pIVar1 = context->validators[pPVar5->dependenciesValidatorIndex];
              uVar2 = (*pIVar1->_vptr_ISchemaValidator[2])();
              if ((uVar2 & 1) == 0) {
                (*context->error_handler->_vptr_IValidationErrorHandler[0x1d])
                          (context->error_handler,pPVar5,pIVar1);
              }
            }
          }
          else {
            (*context->error_handler->_vptr_IValidationErrorHandler[0x1a])();
            for (dependenciesValidator._4_4_ = 0; dependenciesValidator._4_4_ < this->propertyCount_
                ; dependenciesValidator._4_4_ = dependenciesValidator._4_4_ + 1) {
              if (((pPVar5->dependencies[dependenciesValidator._4_4_] & 1U) != 0) &&
                 ((context->propertyExist[dependenciesValidator._4_4_] & 1U) == 0)) {
                (*context->error_handler->_vptr_IValidationErrorHandler[0x1b])
                          (context->error_handler,this->properties_ + dependenciesValidator._4_4_);
              }
            }
            (*context->error_handler->_vptr_IValidationErrorHandler[0x1c])
                      (context->error_handler,pPVar5);
          }
        }
      }
      uVar2 = (*context->error_handler->_vptr_IValidationErrorHandler[0x1e])();
      if ((uVar2 & 1) != 0) {
        context->invalidCode = kValidateErrorDependencies;
        pVVar3 = GetValidateErrorKeyword(kValidateErrorDependencies);
        pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVVar3);
        context->invalidKeyword = pCVar4;
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool EndObject(Context& context, SizeType memberCount) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::EndObject");
        if (hasRequired_) {
            context.error_handler.StartMissingProperties();
            for (SizeType index = 0; index < propertyCount_; index++)
                if (properties_[index].required && !context.propertyExist[index])
                    if (properties_[index].schema->defaultValueLength_ == 0 )
                        context.error_handler.AddMissingProperty(properties_[index].name);
            if (context.error_handler.EndMissingProperties())
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorRequired);
        }

        if (memberCount < minProperties_) {
            context.error_handler.TooFewProperties(memberCount, minProperties_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMinProperties);
        }

        if (memberCount > maxProperties_) {
            context.error_handler.TooManyProperties(memberCount, maxProperties_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMaxProperties);
        }

        if (hasDependencies_) {
            context.error_handler.StartDependencyErrors();
            for (SizeType sourceIndex = 0; sourceIndex < propertyCount_; sourceIndex++) {
                const Property& source = properties_[sourceIndex];
                if (context.propertyExist[sourceIndex]) {
                    if (source.dependencies) {
                        context.error_handler.StartMissingDependentProperties();
                        for (SizeType targetIndex = 0; targetIndex < propertyCount_; targetIndex++)
                            if (source.dependencies[targetIndex] && !context.propertyExist[targetIndex])
                                context.error_handler.AddMissingDependentProperty(properties_[targetIndex].name);
                        context.error_handler.EndMissingDependentProperties(source.name);
                    }
                    else if (source.dependenciesSchema) {
                        ISchemaValidator* dependenciesValidator = context.validators[source.dependenciesValidatorIndex];
                        if (!dependenciesValidator->IsValid())
                            context.error_handler.AddDependencySchemaError(source.name, dependenciesValidator);
                    }
                }
            }
            if (context.error_handler.EndDependencyErrors())
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorDependencies);
        }

        return true;
    }